

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

sexp_conflict
sexp_set_current_effective_group_id_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0)

{
  int iVar1;
  sexp_conflict psVar2;
  __gid_t __gid;
  
  if (((ulong)arg0 & 1) == 0) {
    if ((((ulong)arg0 & 2) != 0) || (arg0->tag != 0xc)) {
      psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2);
      return psVar2;
    }
    __gid = (__gid_t)(arg0->value).string.length;
  }
  else {
    __gid = (__gid_t)((long)arg0 >> 1);
  }
  iVar1 = setegid(__gid);
  return (sexp_conflict)((ulong)(iVar1 == 0) << 8 | 0x3e);
}

Assistant:

sexp sexp_set_current_effective_group_id_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0) {
  int err = 0;
  sexp res;
  if (! sexp_exact_integerp(arg0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg0);
  err = setegid(sexp_uint_value(arg0));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}